

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall
QtMWidgets::SwitchPrivate::drawText
          (SwitchPrivate *this,QPainter *p,QStyleOption *opt,QColor *on,QColor *off)

{
  int aleft;
  State SVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  QIncompatibleFlag local_48;
  QIncompatibleFlag local_44;
  undefined1 local_40 [8];
  QRect r;
  QColor *off_local;
  QColor *on_local;
  QStyleOption *opt_local;
  QPainter *p_local;
  SwitchPrivate *this_local;
  
  aleft = this->radius;
  r._8_8_ = off;
  iVar3 = QRect::width((QRect *)(opt + 0x10));
  QRect::QRect((QRect *)local_40,aleft,0,iVar3 + this->radius * -2,this->radius * 2);
  SVar1 = this->state;
  if (SVar1 < NotAcceptedCheck) {
    bVar2 = QString::isEmpty(&this->offText);
    if (!bVar2) {
      QPainter::setPen((QColor *)p);
      local_48 = Qt::operator|(AlignRight,0x100);
      uVar4 = QIncompatibleFlag::operator_cast_to_int(&local_48);
      QPainter::drawText((QRect *)p,(int)local_40,(QString *)(ulong)(uVar4 | 0x80),
                         (QRect *)&this->offText);
    }
  }
  else if ((SVar1 == NotAcceptedCheck || SVar1 == AcceptedCheck) &&
          (bVar2 = QString::isEmpty(&this->onText), !bVar2)) {
    QPainter::setPen((QColor *)p);
    local_44 = Qt::operator|(AlignLeading,0x100);
    uVar4 = QIncompatibleFlag::operator_cast_to_int(&local_44);
    QPainter::drawText((QRect *)p,(int)local_40,(QString *)(ulong)(uVar4 | 0x80),
                       (QRect *)&this->onText);
  }
  return;
}

Assistant:

void
SwitchPrivate::drawText( QPainter * p, const QStyleOption & opt,
	const QColor & on, const QColor & off )
{
	const QRect r( radius, 0, opt.rect.width() - radius * 2, radius * 2 );

	switch( state )
	{
		case Switch::NotAcceptedCheck :
		case Switch::AcceptedCheck :
		{
			if( !onText.isEmpty() )
			{
				p->setPen( on );
				p->drawText( r,
					Qt::AlignLeft | Qt::TextSingleLine | Qt::AlignVCenter,
					onText );
			}
		}
		break;

		case Switch::NotAcceptedUncheck :
		case Switch::AcceptedUncheck :
		{
			if( !offText.isEmpty() )
			{
				p->setPen( off );
				p->drawText( r,
					Qt::AlignRight | Qt::TextSingleLine | Qt::AlignVCenter,
					offText );
			}
		}
		break;
	}
}